

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  Value *val;
  PSNode *pPVar2;
  Offset OVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long *plVar9;
  op_iterator pUVar10;
  PSNode *pPVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  type tVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  Pointer *ptr;
  pointer puVar20;
  uint uVar21;
  CallBase *pCVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  const_iterator __begin1;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  TimeMeasure tm;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  undefined1 local_420 [8];
  undefined1 local_418 [24];
  Pointer local_400;
  type local_3f0;
  Pointer local_3e8;
  PSNode *local_3d8;
  long local_3d0;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> local_3c8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3b0;
  DGLLVMPointerAnalysis local_3a0;
  undefined1 local_310 [96];
  size_type sStack_2b0;
  AnalysisType local_2a8;
  bool local_2a4;
  undefined1 local_2a0 [96];
  size_type sStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [32];
  
  setupStackTraceOnError(argc,argv);
  iVar13 = 1;
  parseSlicerOptions((int)local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_3c0);
  parseModule((char *)&local_3c8,(LLVMContext *)"llvm-pta-ben",(SlicerOptions *)local_3c0);
  if (local_3c8._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    local_3c0._8_8_ = 0;
    aStack_3b0._M_allocated_capacity = 0;
    local_310._0_8_ = local_310 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_310,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
    local_310._32_8_ = local_2a0._32_8_;
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),
               (_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_2a0 + 0x28));
    local_310._88_8_ = local_2a0._88_8_;
    sStack_2b0 = sStack_240;
    local_2a8 = (undefined4)local_238[0]._M_allocated_capacity;
    local_2a4 = (bool)local_238[0]._4_1_;
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (&local_3a0,
               (Module *)
               local_3c8._M_t.
               super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
               super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
               (LLVMPointerAnalysisOptions *)local_310);
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),(_Link_type)local_310._56_8_);
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
    }
    local_3c0._8_8_ = std::chrono::_V2::steady_clock::now();
    dg::DGLLVMPointerAnalysis::run(&local_3a0);
    aStack_3b0._M_allocated_capacity = std::chrono::_V2::steady_clock::now();
    local_420 = (undefined1  [8])(local_418 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_420,"INFO: Pointer analysis took","");
    dg::debug::TimeMeasure::report
              ((TimeMeasure *)(local_3c0 + 8),(string *)local_420,(ostream *)&std::cerr);
    if (local_420 != (undefined1  [8])(local_418 + 8)) {
      operator_delete((void *)local_420,local_418._8_8_ + 1);
    }
    puVar1 = ((local_3a0.PS)->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    tVar15 = dg::Offset::UNKNOWN;
    for (puVar20 = ((local_3a0.PS)->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar1;
        puVar20 = puVar20 + 1) {
      pPVar11 = (puVar20->_M_t).
                super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
                super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
                super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if ((((pPVar11 == (PSNode *)0x0) || (*(int *)(pPVar11 + 0x90) != 8)) ||
          (pCVar22 = *(CallBase **)(pPVar11 + 0x18), pCVar22 == (CallBase *)0x0)) ||
         (pCVar22[0x10] != (CallBase)0x53)) goto switchD_0010c9b9_caseD_3;
      lVar19 = *(long *)(pCVar22 + -0x20);
      if (lVar19 == 0) {
        lVar19 = 0;
      }
      else if (*(char *)(lVar19 + 0x10) != '\0') {
        lVar19 = 0;
      }
      if ((lVar19 == 0) || (*(long *)(lVar19 + 0x18) != *(long *)(pCVar22 + 0x48))) {
        lVar19 = 0;
      }
      if (lVar19 == 0) goto switchD_0010c9b9_caseD_3;
      auVar30 = llvm::Value::getName();
      lVar19 = auVar30._8_8_;
      plVar9 = auVar30._0_8_;
      pUVar10 = llvm::CallBase::arg_end(pCVar22);
      pCVar22 = pCVar22 + -(ulong)(uint)(*(int *)(pCVar22 + 0x14) << 5);
      if (((long)pUVar10 - (long)pCVar22 & 0x1fffffffe0U) != 0x40) goto switchD_0010c9b9_caseD_3;
      local_3d0 = lVar19 + -7;
      switch(local_3d0) {
      case 0:
        if (*(int *)((long)plVar9 + 3) == 0x5341494c && (int)*plVar9 == 0x4c414f4e)
        goto LAB_0010cb25;
        if (0xb < lVar19) {
          if (lVar19 != 0xc) goto joined_r0x0010caad;
          goto switchD_0010c9b9_caseD_5;
        }
        if (lVar19 == 8) goto switchD_0010c9b9_caseD_1;
        if (lVar19 == 9) goto switchD_0010c9b9_caseD_2;
        break;
      case 1:
switchD_0010c9b9_caseD_1:
        if (*plVar9 == 0x5341494c4159414d) goto LAB_0010cb25;
        if (0x13 < lVar19) goto joined_r0x0010caad;
        if (lVar19 == 9) goto switchD_0010c9b9_caseD_2;
LAB_0010ca6b:
        if (lVar19 == 0xc) goto switchD_0010c9b9_caseD_5;
        break;
      case 2:
switchD_0010c9b9_caseD_2:
        if ((char)plVar9[1] == 'S' && *plVar9 == 0x41494c415453554d) goto LAB_0010cb25;
        if (lVar19 == 0x15) goto switchD_0010c9b9_caseD_e;
        if (lVar19 != 0x14) goto LAB_0010ca6b;
      case 0xd:
switchD_0010c9b9_caseD_d:
        iVar13 = (int)plVar9[2];
        auVar27[0] = -((char)iVar13 == 'L');
        auVar27[1] = -((char)((uint)iVar13 >> 8) == 'I');
        auVar27[2] = -((char)((uint)iVar13 >> 0x10) == 'A');
        auVar27[3] = -((char)((uint)iVar13 >> 0x18) == 'S');
        auVar27[4] = 0xff;
        auVar27[5] = 0xff;
        auVar27[6] = 0xff;
        auVar27[7] = 0xff;
        auVar27[8] = 0xff;
        auVar27[9] = 0xff;
        auVar27[10] = 0xff;
        auVar27[0xb] = 0xff;
        auVar27[0xc] = 0xff;
        auVar27[0xd] = 0xff;
        auVar27[0xe] = 0xff;
        auVar27[0xf] = 0xff;
        auVar23[0] = -((char)*plVar9 == 'E');
        auVar23[1] = -(*(char *)((long)plVar9 + 1) == 'X');
        auVar23[2] = -(*(char *)((long)plVar9 + 2) == 'P');
        auVar23[3] = -(*(char *)((long)plVar9 + 3) == 'E');
        auVar23[4] = -(*(char *)((long)plVar9 + 4) == 'C');
        auVar23[5] = -(*(char *)((long)plVar9 + 5) == 'T');
        auVar23[6] = -(*(char *)((long)plVar9 + 6) == 'E');
        auVar23[7] = -(*(char *)((long)plVar9 + 7) == 'D');
        auVar23[8] = -((char)plVar9[1] == 'F');
        auVar23[9] = -(*(char *)((long)plVar9 + 9) == 'A');
        auVar23[10] = -(*(char *)((long)plVar9 + 10) == 'I');
        auVar23[0xb] = -(*(char *)((long)plVar9 + 0xb) == 'L');
        auVar23[0xc] = -(*(char *)((long)plVar9 + 0xc) == '_');
        auVar23[0xd] = -(*(char *)((long)plVar9 + 0xd) == 'N');
        auVar23[0xe] = -(*(char *)((long)plVar9 + 0xe) == 'O');
        auVar23[0xf] = -(*(char *)((long)plVar9 + 0xf) == 'A');
        auVar23 = auVar23 & auVar27;
        if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) break;
LAB_0010cb25:
        val = *(Value **)(pCVar22 + 0x20);
        pPVar11 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                            ((LLVMPointerGraphBuilder *)
                             local_3a0._builder._M_t.
                             super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                             .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                             _M_head_impl,*(Value **)pCVar22);
        local_3d8 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                              ((LLVMPointerGraphBuilder *)
                               local_3a0._builder._M_t.
                               super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                               .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                               _M_head_impl,val);
        local_420 = *(undefined1 (*) [8])(pPVar11 + 0xc0);
        local_418._8_8_ = 0;
        if (*(long *)(pPVar11 + 200) != 0) {
          if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
            local_418._8_8_ = 0;
            do {
              if (local_418._8_8_ == 0x3f) {
                local_418._8_8_ = 0x40;
                break;
              }
              bVar12 = (byte)local_418._8_8_;
              local_418._8_8_ = local_418._8_8_ + 1;
            } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
          }
          else {
            local_418._8_8_ = 0;
          }
        }
        local_418._0_8_ = (__node_type *)0x0;
        if ((local_418._8_8_ != 0) || (uVar21 = 0, local_420 != (undefined1  [8])0x0)) {
          uVar21 = 0;
          do {
            do {
              uVar21 = uVar21 + 1;
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++((const_iterator *)local_420);
            } while (local_418._8_8_ != 0);
          } while (local_420 != (undefined1  [8])0x0);
        }
        local_420 = *(undefined1 (*) [8])(local_3d8 + 0xc0);
        local_418._0_16_ = (undefined1  [16])0x0;
        if (*(long *)(local_3d8 + 200) != 0) {
          if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
            local_418._8_8_ = 0;
            do {
              if (local_418._8_8_ == 0x3f) {
                local_418._8_8_ = 0x40;
                break;
              }
              bVar12 = (byte)local_418._8_8_;
              local_418._8_8_ = local_418._8_8_ + 1;
            } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
          }
          else {
            local_418._8_8_ = 0;
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_418._8_8_;
          local_418._0_16_ = auVar4 << 0x40;
        }
        local_3f0 = tVar15;
        if ((local_418._8_8_ != 0) || (uVar14 = 0, local_420 != (undefined1  [8])0x0)) {
          uVar14 = 0;
          do {
            do {
              uVar14 = uVar14 + 1;
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++((const_iterator *)local_420);
            } while (local_418._8_8_ != 0);
          } while (local_420 != (undefined1  [8])0x0);
        }
        printf("counts = %d %d\n",(ulong)uVar21,(ulong)uVar14);
        tVar15 = local_3f0;
        if ((uVar14 | uVar21) < 2) {
          local_400.target = dg::pta::UNKNOWN_MEMORY;
          local_400.offset.offset = local_3f0;
          local_3e8.target = dg::pta::UNKNOWN_MEMORY;
          local_3e8.offset.offset = local_3f0;
          uVar8 = 1;
          if ((uVar14 | uVar21) != 0) {
            pPVar2 = local_400.target;
            OVar3.offset = local_400.offset.offset;
            if (uVar21 == 1) {
              local_420 = *(undefined1 (*) [8])(pPVar11 + 0xc0);
              local_418._0_16_ = (undefined1  [16])0x0;
              if (*(long *)(pPVar11 + 200) != 0) {
                if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
                  local_418._8_8_ = 0;
                  do {
                    if (local_418._8_8_ == 0x3f) {
                      local_418._8_8_ = 0x40;
                      break;
                    }
                    bVar12 = (byte)local_418._8_8_;
                    local_418._8_8_ = local_418._8_8_ + 1;
                  } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
                }
                else {
                  local_418._8_8_ = 0;
                }
                auVar6._8_8_ = 0;
                auVar6._0_8_ = local_418._8_8_;
                local_418._0_16_ = auVar6 << 0x40;
              }
              lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
              local_400.target =
                   *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
              local_400.offset.offset =
                   *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
              if ((local_418._8_8_ != 0) ||
                 (pPVar2 = local_400.target, OVar3.offset = local_400.offset.offset,
                 local_420 != (undefined1  [8])0x0)) {
                do {
                  lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
                  pPVar2 = *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
                  OVar3.offset = *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
                  if ((pPVar2 != dg::pta::NULLPTR) && (pPVar2 != dg::pta::UNKNOWN_MEMORY)) break;
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_420);
                } while (local_420 != (undefined1  [8])0x0 || local_418._8_8_ != 0);
              }
            }
            local_400.offset.offset = OVar3.offset;
            local_400.target = pPVar2;
            pPVar11 = local_3e8.target;
            OVar3.offset = local_3e8.offset.offset;
            if (uVar14 == 1) {
              local_420 = *(undefined1 (*) [8])(local_3d8 + 0xc0);
              local_418._0_16_ = (undefined1  [16])0x0;
              if (*(long *)(local_3d8 + 200) != 0) {
                if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
                  local_418._8_8_ = 0;
                  do {
                    if (local_418._8_8_ == 0x3f) {
                      local_418._8_8_ = 0x40;
                      break;
                    }
                    bVar12 = (byte)local_418._8_8_;
                    local_418._8_8_ = local_418._8_8_ + 1;
                  } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
                }
                else {
                  local_418._8_8_ = 0;
                }
                auVar7._8_8_ = 0;
                auVar7._0_8_ = local_418._8_8_;
                local_418._0_16_ = auVar7 << 0x40;
              }
              lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
              local_3e8.target =
                   *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
              local_3e8.offset.offset =
                   *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
              if ((local_418._8_8_ != 0) ||
                 (pPVar11 = local_3e8.target, OVar3.offset = local_3e8.offset.offset,
                 local_420 != (undefined1  [8])0x0)) {
                do {
                  lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
                  pPVar11 = *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
                  OVar3.offset = *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
                  if ((pPVar11 != dg::pta::NULLPTR) && (pPVar11 != dg::pta::UNKNOWN_MEMORY)) break;
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_420);
                } while (local_420 != (undefined1  [8])0x0 || local_418._8_8_ != 0);
              }
            }
            local_3e8.offset.offset = OVar3.offset;
            local_3e8.target = pPVar11;
            if (uVar21 == 0) {
              ptr = &local_3e8;
              pcVar17 = "2";
            }
            else {
              ptr = &local_400;
              pcVar17 = "1";
              if (uVar14 != 0) {
                dump_pointer(ptr,"1");
                dump_pointer(&local_3e8,"2");
                uVar8 = 2;
                tVar15 = local_3f0;
                if (((local_400.target != dg::pta::UNKNOWN_MEMORY) &&
                    (local_3e8.target != dg::pta::UNKNOWN_MEMORY)) &&
                   ((local_400.target != local_3e8.target ||
                    (((local_400.offset.offset != local_3f0 &&
                      (local_3e8.offset.offset != local_3f0)) &&
                     (uVar8 = 3, local_400.offset.offset != local_3e8.offset.offset)))))) {
                  uVar8 = 1;
                }
                goto LAB_0010d0f5;
              }
            }
            uVar8 = check_pointer(ptr,pcVar17);
            tVar15 = local_3f0;
          }
        }
        else {
          local_420 = *(undefined1 (*) [8])(pPVar11 + 0xc0);
          local_418._8_8_ = 0;
          if (*(long *)(pPVar11 + 200) != 0) {
            if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
              local_418._8_8_ = 0;
              do {
                if (local_418._8_8_ == 0x3f) {
                  local_418._8_8_ = 0x40;
                  break;
                }
                bVar12 = (byte)local_418._8_8_;
                local_418._8_8_ = local_418._8_8_ + 1;
              } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
            }
            else {
              local_418._8_8_ = 0;
            }
          }
          local_418._0_8_ = (__node_type *)0x0;
          if ((local_418._8_8_ != 0) || (local_420 != (undefined1  [8])0x0)) {
            do {
              lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
              local_400.target =
                   *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
              local_400.offset.offset =
                   *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
              if ((local_400.target != dg::pta::NULLPTR) &&
                 (local_400.target != dg::pta::UNKNOWN_MEMORY)) {
                dump_pointer(&local_400,"1");
              }
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++((const_iterator *)local_420);
            } while (local_420 != (undefined1  [8])0x0 || local_418._8_8_ != 0);
          }
          local_420 = *(undefined1 (*) [8])(local_3d8 + 0xc0);
          local_418._0_16_ = (undefined1  [16])0x0;
          if (*(long *)(local_3d8 + 200) != 0) {
            if ((*(ulong *)((long)local_420 + 0x10) & 1) == 0) {
              local_418._8_8_ = 0;
              do {
                if (local_418._8_8_ == 0x3f) {
                  local_418._8_8_ = 0x40;
                  break;
                }
                bVar12 = (byte)local_418._8_8_;
                local_418._8_8_ = local_418._8_8_ + 1;
              } while ((*(ulong *)((long)local_420 + 0x10) >> (bVar12 & 0x3f) & 2) == 0);
            }
            else {
              local_418._8_8_ = 0;
            }
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_418._8_8_;
            local_418._0_16_ = auVar5 << 0x40;
          }
          if ((local_418._8_8_ != 0) || (local_420 != (undefined1  [8])0x0)) {
            do {
              lVar16 = local_418._8_8_ * 0x10 + llvm::DisableABIBreakingChecks;
              local_400.target =
                   *(PSNode **)(*(long *)((long)local_420 + 8) * 0x10 + -0x10 + lVar16);
              local_400.offset.offset =
                   *(type *)(*(long *)((long)local_420 + 8) * 0x10 + -8 + lVar16);
              if ((local_400.target != dg::pta::NULLPTR) &&
                 (local_400.target != dg::pta::UNKNOWN_MEMORY)) {
                dump_pointer(&local_400,"2");
              }
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++((const_iterator *)local_420);
            } while (local_420 != (undefined1  [8])0x0 || local_418._8_8_ != 0);
          }
          uVar8 = 2;
        }
LAB_0010d0f5:
        switch(local_3d0) {
        case 0:
          if (*(int *)((long)plVar9 + 3) == 0x5341494c && (int)*plVar9 == 0x4c414f4e) {
            pcVar18 = (char *)((long)&DAT_00114158 +
                              (long)*(int *)(&UNK_00114154 + (long)(int)uVar8 * 4));
            pcVar17 = "NO";
            goto LAB_0010d325;
          }
          if (0xb < lVar19) {
            if (lVar19 != 0xc) goto joined_r0x0010d25d;
            goto switchD_0010d114_caseD_5;
          }
          if (lVar19 == 8) goto switchD_0010d114_caseD_1;
LAB_0010d1e2:
          if (lVar19 == 9) goto switchD_0010d114_caseD_2;
          break;
        case 1:
switchD_0010d114_caseD_1:
          if (*plVar9 == 0x5341494c4159414d) goto LAB_0010d21d;
          if (0x13 < lVar19) goto joined_r0x0010d25d;
          if (lVar19 == 9) goto switchD_0010d114_caseD_2;
          if (lVar19 == 0xc) goto switchD_0010d114_caseD_5;
          break;
        case 2:
switchD_0010d114_caseD_2:
          if ((char)plVar9[1] == 'S' && *plVar9 == 0x41494c415453554d) {
            pcVar18 = (char *)((long)&DAT_00114170 +
                              (long)*(int *)(&UNK_0011416c + (long)(int)uVar8 * 4));
            pcVar17 = "MUST";
            goto LAB_0010d325;
          }
joined_r0x0010d25d:
          if (lVar19 == 0x14) goto switchD_0010d114_caseD_d;
          if (lVar19 == 0x15) goto switchD_0010d114_caseD_e;
          break;
        case 5:
switchD_0010d114_caseD_5:
          if ((int)plVar9[1] == 0x5341494c && *plVar9 == 0x414c414954524150) {
LAB_0010d21d:
            pcVar18 = (char *)((long)&DAT_00114164 +
                              (long)*(int *)(&UNK_00114160 + (long)(int)uVar8 * 4));
            pcVar17 = "MAY";
            goto LAB_0010d325;
          }
          if (lVar19 == 0x15) goto switchD_0010d114_caseD_e;
          if (lVar19 != 0x14) goto LAB_0010d1e2;
        case 0xd:
switchD_0010d114_caseD_d:
          iVar13 = (int)plVar9[2];
          auVar29[0] = -((char)iVar13 == 'L');
          auVar29[1] = -((char)((uint)iVar13 >> 8) == 'I');
          auVar29[2] = -((char)((uint)iVar13 >> 0x10) == 'A');
          auVar29[3] = -((char)((uint)iVar13 >> 0x18) == 'S');
          auVar29[4] = 0xff;
          auVar29[5] = 0xff;
          auVar29[6] = 0xff;
          auVar29[7] = 0xff;
          auVar29[8] = 0xff;
          auVar29[9] = 0xff;
          auVar29[10] = 0xff;
          auVar29[0xb] = 0xff;
          auVar29[0xc] = 0xff;
          auVar29[0xd] = 0xff;
          auVar29[0xe] = 0xff;
          auVar29[0xf] = 0xff;
          auVar25[0] = -((char)*plVar9 == 'E');
          auVar25[1] = -(*(char *)((long)plVar9 + 1) == 'X');
          auVar25[2] = -(*(char *)((long)plVar9 + 2) == 'P');
          auVar25[3] = -(*(char *)((long)plVar9 + 3) == 'E');
          auVar25[4] = -(*(char *)((long)plVar9 + 4) == 'C');
          auVar25[5] = -(*(char *)((long)plVar9 + 5) == 'T');
          auVar25[6] = -(*(char *)((long)plVar9 + 6) == 'E');
          auVar25[7] = -(*(char *)((long)plVar9 + 7) == 'D');
          auVar25[8] = -((char)plVar9[1] == 'F');
          auVar25[9] = -(*(char *)((long)plVar9 + 9) == 'A');
          auVar25[10] = -(*(char *)((long)plVar9 + 10) == 'I');
          auVar25[0xb] = -(*(char *)((long)plVar9 + 0xb) == 'L');
          auVar25[0xc] = -(*(char *)((long)plVar9 + 0xc) == '_');
          auVar25[0xd] = -(*(char *)((long)plVar9 + 0xd) == 'N');
          auVar25[0xe] = -(*(char *)((long)plVar9 + 0xe) == 'O');
          auVar25[0xf] = -(*(char *)((long)plVar9 + 0xf) == 'A');
          auVar25 = auVar25 & auVar29;
          if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
            pcVar18 = "true";
            if (uVar8 == 1) {
              pcVar18 = "false";
            }
            pcVar17 = "EXPECTEDFAIL_NO";
LAB_0010d325:
            printf("  pta %s %s ex %s\n",pcVar18,
                   (long)&DAT_0011417c + (long)*(int *)(&UNK_00114178 + (long)(int)uVar8 * 4),
                   pcVar17);
          }
          break;
        case 0xe:
switchD_0010d114_caseD_e:
          auVar28[0] = -(*(char *)((long)plVar9 + 5) == 'T');
          auVar28[1] = -(*(char *)((long)plVar9 + 6) == 'E');
          auVar28[2] = -(*(char *)((long)plVar9 + 7) == 'D');
          auVar28[3] = -((char)plVar9[1] == 'F');
          auVar28[4] = -(*(char *)((long)plVar9 + 9) == 'A');
          auVar28[5] = -(*(char *)((long)plVar9 + 10) == 'I');
          auVar28[6] = -(*(char *)((long)plVar9 + 0xb) == 'L');
          auVar28[7] = -(*(char *)((long)plVar9 + 0xc) == '_');
          auVar28[8] = -(*(char *)((long)plVar9 + 0xd) == 'M');
          auVar28[9] = -(*(char *)((long)plVar9 + 0xe) == 'A');
          auVar28[10] = -(*(char *)((long)plVar9 + 0xf) == 'Y');
          auVar28[0xb] = -((char)plVar9[2] == 'A');
          auVar28[0xc] = -(*(char *)((long)plVar9 + 0x11) == 'L');
          auVar28[0xd] = -(*(char *)((long)plVar9 + 0x12) == 'I');
          auVar28[0xe] = -(*(char *)((long)plVar9 + 0x13) == 'A');
          auVar28[0xf] = -(*(char *)((long)plVar9 + 0x14) == 'S');
          auVar24[0] = -((char)*plVar9 == 'E');
          auVar24[1] = -(*(char *)((long)plVar9 + 1) == 'X');
          auVar24[2] = -(*(char *)((long)plVar9 + 2) == 'P');
          auVar24[3] = -(*(char *)((long)plVar9 + 3) == 'E');
          auVar24[4] = -(*(char *)((long)plVar9 + 4) == 'C');
          auVar24[5] = -(*(char *)((long)plVar9 + 5) == 'T');
          auVar24[6] = -(*(char *)((long)plVar9 + 6) == 'E');
          auVar24[7] = -(*(char *)((long)plVar9 + 7) == 'D');
          auVar24[8] = -((char)plVar9[1] == 'F');
          auVar24[9] = -(*(char *)((long)plVar9 + 9) == 'A');
          auVar24[10] = -(*(char *)((long)plVar9 + 10) == 'I');
          auVar24[0xb] = -(*(char *)((long)plVar9 + 0xb) == 'L');
          auVar24[0xc] = -(*(char *)((long)plVar9 + 0xc) == '_');
          auVar24[0xd] = -(*(char *)((long)plVar9 + 0xd) == 'M');
          auVar24[0xe] = -(*(char *)((long)plVar9 + 0xe) == 'A');
          auVar24[0xf] = -(*(char *)((long)plVar9 + 0xf) == 'Y');
          auVar24 = auVar24 & auVar28;
          if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
            if (lVar19 == 0x14) goto switchD_0010d114_caseD_d;
            break;
          }
          pcVar18 = "true";
          pcVar17 = "EXPECTEDFAIL_MAY";
          if ((uVar8 & 0xfffffffd) != 1) {
            pcVar18 = "unknown";
            if (uVar8 == 2) {
              pcVar18 = "inadequate";
            }
            pcVar17 = "EXPECTEDFAIL_MAY";
          }
          goto LAB_0010d325;
        }
        break;
      case 5:
switchD_0010c9b9_caseD_5:
        if ((int)plVar9[1] == 0x5341494c && *plVar9 == 0x414c414954524150) goto LAB_0010cb25;
joined_r0x0010caad:
        if (lVar19 == 0x14) goto switchD_0010c9b9_caseD_d;
        if (lVar19 == 0x15) goto switchD_0010c9b9_caseD_e;
        break;
      case 0xe:
switchD_0010c9b9_caseD_e:
        auVar26[0] = -(*(char *)((long)plVar9 + 5) == 'T');
        auVar26[1] = -(*(char *)((long)plVar9 + 6) == 'E');
        auVar26[2] = -(*(char *)((long)plVar9 + 7) == 'D');
        auVar26[3] = -((char)plVar9[1] == 'F');
        auVar26[4] = -(*(char *)((long)plVar9 + 9) == 'A');
        auVar26[5] = -(*(char *)((long)plVar9 + 10) == 'I');
        auVar26[6] = -(*(char *)((long)plVar9 + 0xb) == 'L');
        auVar26[7] = -(*(char *)((long)plVar9 + 0xc) == '_');
        auVar26[8] = -(*(char *)((long)plVar9 + 0xd) == 'M');
        auVar26[9] = -(*(char *)((long)plVar9 + 0xe) == 'A');
        auVar26[10] = -(*(char *)((long)plVar9 + 0xf) == 'Y');
        auVar26[0xb] = -((char)plVar9[2] == 'A');
        auVar26[0xc] = -(*(char *)((long)plVar9 + 0x11) == 'L');
        auVar26[0xd] = -(*(char *)((long)plVar9 + 0x12) == 'I');
        auVar26[0xe] = -(*(char *)((long)plVar9 + 0x13) == 'A');
        auVar26[0xf] = -(*(char *)((long)plVar9 + 0x14) == 'S');
        auVar30[0] = -((char)*plVar9 == 'E');
        auVar30[1] = -(*(char *)((long)plVar9 + 1) == 'X');
        auVar30[2] = -(*(char *)((long)plVar9 + 2) == 'P');
        auVar30[3] = -(*(char *)((long)plVar9 + 3) == 'E');
        auVar30[4] = -(*(char *)((long)plVar9 + 4) == 'C');
        auVar30[5] = -(*(char *)((long)plVar9 + 5) == 'T');
        auVar30[6] = -(*(char *)((long)plVar9 + 6) == 'E');
        auVar30[7] = -(*(char *)((long)plVar9 + 7) == 'D');
        auVar30[8] = -((char)plVar9[1] == 'F');
        auVar30[9] = -(*(char *)((long)plVar9 + 9) == 'A');
        auVar30[10] = -(*(char *)((long)plVar9 + 10) == 'I');
        auVar30[0xb] = -(*(char *)((long)plVar9 + 0xb) == 'L');
        auVar30[0xc] = -(*(char *)((long)plVar9 + 0xc) == '_');
        auVar30[0xd] = -(*(char *)((long)plVar9 + 0xd) == 'M');
        auVar30[0xe] = -(*(char *)((long)plVar9 + 0xe) == 'A');
        auVar30[0xf] = -(*(char *)((long)plVar9 + 0xf) == 'Y');
        auVar30 = auVar30 & auVar26;
        if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) {
          if (lVar19 == 0x14) goto switchD_0010c9b9_caseD_d;
          break;
        }
        goto LAB_0010cb25;
      }
switchD_0010c9b9_caseD_3:
    }
    local_3a0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
         (_func_int **)&PTR_hasPointsTo_001187e0;
    std::
    unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
    ::~unique_ptr(&local_3a0._builder);
    if (local_3a0.PTA._M_t.
        super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
        ._M_t.
        super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
        .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>)
        0x0) {
      (*(*(_func_int ***)
          local_3a0.PTA._M_t.
          super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
          ._M_t.
          super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
          .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl)[1])();
    }
    local_3a0.PTA._M_t.
    super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
         (__uniq_ptr_data<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>,_true,_true>
          )(__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
            )0x0;
    dg::LLVMPointerAnalysis::~LLVMPointerAnalysis(&local_3a0.super_LLVMPointerAnalysis);
    iVar13 = 0;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&local_3c8);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_3c0);
  SlicerOptions::~SlicerOptions((SlicerOptions *)local_2a0);
  return iVar13;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-ben", context, options);
    if (!M)
        return 1;

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    evalPTA(&PTA);

    return 0;
}